

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::WriteBuildFileTop(cmLocalNinjaGenerator *this)

{
  cmGeneratedFileStream *pcVar1;
  cmLocalNinjaGenerator *this_local;
  
  pcVar1 = GetBuildFileStream(this);
  WriteProjectHeader(this,(ostream *)pcVar1);
  pcVar1 = GetBuildFileStream(this);
  WriteNinjaRequiredVersion(this,(ostream *)pcVar1);
  pcVar1 = GetBuildFileStream(this);
  WriteNinjaFilesInclusion(this,(ostream *)pcVar1);
  pcVar1 = GetRulesFileStream(this);
  WriteProjectHeader(this,(ostream *)pcVar1);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteBuildFileTop()
{
  // For the build file.
  this->WriteProjectHeader(this->GetBuildFileStream());
  this->WriteNinjaRequiredVersion(this->GetBuildFileStream());
  this->WriteNinjaFilesInclusion(this->GetBuildFileStream());

  // For the rule file.
  this->WriteProjectHeader(this->GetRulesFileStream());
}